

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O0

void __thiscall rw::TexDictionary::destroy(TexDictionary *this)

{
  Texture *pTVar1;
  Texture *pTVar2;
  TexDictionary *__filename;
  Texture *tex;
  LLLink *lnk;
  LLLink *_next;
  TexDictionary *this_local;
  
  if (*(TexDictionary **)(engine + 8 + (long)textureModuleOffset) == this) {
    *(undefined8 *)(engine + 8 + (long)textureModuleOffset) = 0;
  }
  tex = (Texture *)(this->textures).link.next;
  while( true ) {
    pTVar1 = (Texture *)tex->raster;
    pTVar2 = (Texture *)LinkList::end(&this->textures);
    if (tex == pTVar2) break;
    pTVar2 = Texture::fromDict((LLLink *)tex);
    remove(this,(char *)pTVar2);
    Texture::destroy(pTVar2);
    tex = pTVar1;
  }
  __filename = this;
  PluginList::destruct((PluginList *)&s_plglist,this);
  LLLink::remove(&this->inGlobalList,(char *)__filename);
  (*DAT_001660a8)(this);
  numAllocated = numAllocated + -1;
  return;
}

Assistant:

void
TexDictionary::destroy(void)
{
	if(TEXTUREGLOBAL(currentTexDict) == this)
		TEXTUREGLOBAL(currentTexDict) = nil;
	FORLIST(lnk, this->textures){
		Texture *tex = Texture::fromDict(lnk);
		this->remove(tex);
		tex->destroy();
	}
	s_plglist.destruct(this);
	this->inGlobalList.remove();
	rwFree(this);
	numAllocated--;
}